

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cached-powers.cc
# Opt level: O2

void double_conversion::PowersOfTenCache::GetCachedPowerForBinaryExponentRange
               (int min_exponent,int max_exponent,DiyFp *power,int *decimal_exponent)

{
  short sVar1;
  uint64_t uVar2;
  long lVar3;
  double dVar4;
  
  dVar4 = ceil((double)(min_exponent + 0x3f) * 0.30102999566398114);
  lVar3 = (long)(((int)dVar4 + 0x15b) / 8) * 0x10;
  uVar2 = *(uint64_t *)(kCachedPowers + lVar3 + 0x10);
  sVar1 = *(short *)(kCachedPowers + lVar3 + 0x18);
  *decimal_exponent = (int)*(short *)(kCachedPowers + lVar3 + 0x1a);
  power->f_ = uVar2;
  power->e_ = (int)sVar1;
  return;
}

Assistant:

void GetCachedPowerForBinaryExponentRange(
    int min_exponent,
    int max_exponent,
    DiyFp* power,
    int* decimal_exponent) {
  int kQ = DiyFp::kSignificandSize;
  double k = ceil((min_exponent + kQ - 1) * kD_1_LOG2_10);
  int foo = kCachedPowersOffset;
  int index =
      (foo + static_cast<int>(k) - 1) / kDecimalExponentDistance + 1;
  DOUBLE_CONVERSION_ASSERT(0 <= index && index < static_cast<int>(DOUBLE_CONVERSION_ARRAY_SIZE(kCachedPowers)));
  CachedPower cached_power = kCachedPowers[index];
  DOUBLE_CONVERSION_ASSERT(min_exponent <= cached_power.binary_exponent);
  (void) max_exponent;  // Mark variable as used.
  DOUBLE_CONVERSION_ASSERT(cached_power.binary_exponent <= max_exponent);
  *decimal_exponent = cached_power.decimal_exponent;
  *power = DiyFp(cached_power.significand, cached_power.binary_exponent);
}